

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

bool __thiscall capnp::SchemaLoader::Validator::validate(Validator *this,Reader *node)

{
  void *pvVar1;
  uint uVar2;
  uint64_t scopeId;
  undefined1 uVar3;
  ArrayPtr<const_char> AVar4;
  DebugExpression<bool> _kjCondition;
  Fault f;
  ListElementCount LStack_90;
  anon_class_16_2_3fe397bd _kjContextFunc224;
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_schema_loader_c__:224:5)>
  _kjContext224;
  
  this->isValid = true;
  AVar4 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(node);
  (this->nodeName).super_StringPtr.content = AVar4;
  kj::
  Table<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry,_kj::TreeIndex<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Callbacks>_>
  ::clear(&(this->dependencies).table);
  _kjContextFunc224.this = this;
  _kjContextFunc224.node = node;
  kj::_::Debug::
  ContextImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++:224:5)>
  ::ContextImpl(&_kjContext224,&_kjContextFunc224);
  capnp::schema::Node::Reader::getParameters((Reader *)&f,node);
  if (LStack_90 == 0) {
    uVar2 = (node->_reader).dataSize;
    if (0x6f < uVar2) {
LAB_00166b63:
      pvVar1 = (node->_reader).data;
      switch(*(undefined2 *)((long)pvVar1 + 0xc)) {
      case 1:
        f.exception = (Exception *)(node->_reader).segment;
        if (uVar2 < 0xc0) {
          scopeId = 0;
        }
        else {
          scopeId = *(uint64_t *)((long)pvVar1 + 0x10);
        }
        validate(this,(Reader *)&f,scopeId);
        break;
      case 2:
        f.exception = (Exception *)(node->_reader).segment;
        validate(this,(Reader *)&f);
        break;
      case 3:
        f.exception = (Exception *)(node->_reader).segment;
        validate(this,(Reader *)&f);
        break;
      case 4:
        f.exception = (Exception *)(node->_reader).segment;
        validate(this,(Reader *)&f);
        break;
      case 5:
        f.exception = (Exception *)(node->_reader).segment;
        validate(this,(Reader *)&f);
      }
    }
    uVar3 = this->isValid;
  }
  else {
    uVar2 = (node->_reader).dataSize;
    if (uVar2 < 0x121) {
      _kjCondition.value = false;
    }
    else {
      _kjCondition.value = (bool)(*(byte *)((long)(node->_reader).data + 0x24) & 1);
      if (_kjCondition.value != false) goto LAB_00166b63;
    }
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[55]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0xe3,FAILED,"node.getIsGeneric()",
               "_kjCondition,\"if parameter list is non-empty, isGeneric must be true\"",
               &_kjCondition,(char (*) [55])"if parameter list is non-empty, isGeneric must be true"
              );
    this->isValid = false;
    kj::_::Debug::Fault::~Fault(&f);
    uVar3 = 0;
  }
  kj::_::Debug::Context::~Context(&_kjContext224.super_Context);
  return (bool)uVar3;
}

Assistant:

bool validate(const schema::Node::Reader& node) {
    isValid = true;
    nodeName = node.getDisplayName();
    dependencies.clear();

    KJ_CONTEXT("validating schema node", nodeName, (uint)node.which());

    if (node.getParameters().size() > 0) {
      KJ_REQUIRE(node.getIsGeneric(), "if parameter list is non-empty, isGeneric must be true") {
        isValid = false;
        return false;
      }
    }

    switch (node.which()) {
      case schema::Node::FILE:
        verifyVoid(node.getFile());
        break;
      case schema::Node::STRUCT:
        validate(node.getStruct(), node.getScopeId());
        break;
      case schema::Node::ENUM:
        validate(node.getEnum());
        break;
      case schema::Node::INTERFACE:
        validate(node.getInterface());
        break;
      case schema::Node::CONST:
        validate(node.getConst());
        break;
      case schema::Node::ANNOTATION:
        validate(node.getAnnotation());
        break;
    }

    // We accept and pass through node types we don't recognize.
    return isValid;
  }